

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void mkdir_cb(uv_fs_t *req)

{
  int iVar1;
  char *pcVar2;
  uv_fs_t *puVar3;
  uv_dirent_t dent;
  uv_dirent_t uStack_40;
  
  if (req == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_0015140e;
    if (mkdir_req.result != 0) goto LAB_00151413;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_00151418;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      uv_fs_req_cleanup(&mkdir_req);
      return;
    }
  }
  else {
    mkdir_cb_cold_1();
LAB_0015140e:
    mkdir_cb_cold_2();
LAB_00151413:
    mkdir_cb_cold_3();
LAB_00151418:
    mkdir_cb_cold_5();
  }
  mkdir_cb_cold_4();
  if (req == &scandir_req) {
    puVar3 = req;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00151529;
    if (scandir_req.result != 2) goto LAB_0015152e;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00151533;
    puVar3 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStack_40);
    req = (uv_fs_t *)uStack_40.name;
    while (iVar1 != -0xfff) {
      pcVar2 = "file1";
      uStack_40.name = (char *)req;
      iVar1 = strcmp((char *)req,"file1");
      if (iVar1 != 0) {
        pcVar2 = "file2";
        iVar1 = strcmp((char *)req,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00151524;
        }
      }
      dent.name = (char *)(ulong)uStack_40.type;
      dent._8_8_ = pcVar2;
      assert_is_file_type(dent);
      puVar3 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&uStack_40);
      req = (uv_fs_t *)uStack_40.name;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_00151538;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_0015153d;
    puVar3 = &scandir_req;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
LAB_00151524:
    scandir_cb_cold_1();
    puVar3 = req;
LAB_00151529:
    scandir_cb_cold_2();
LAB_0015152e:
    scandir_cb_cold_3();
LAB_00151533:
    scandir_cb_cold_8();
LAB_00151538:
    scandir_cb_cold_7();
LAB_0015153d:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar3 < 2) {
    return;
  }
  assert_is_file_type_cold_1();
  if (puVar3 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_001515a5;
    if (stat_req.result != 0) goto LAB_001515aa;
    if (stat_req.ptr == (void *)0x0) goto LAB_001515af;
    stat_cb_count = stat_cb_count + 1;
    puVar3 = &stat_req;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    stat_cb_cold_1();
LAB_001515a5:
    stat_cb_cold_2();
LAB_001515aa:
    stat_cb_cold_3();
LAB_001515af:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar3 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_001515f1;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_001515f1:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar3 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00151655;
    if (rmdir_req.result != 0) goto LAB_0015165a;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_00151664;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00151655:
    rmdir_cb_cold_2();
LAB_0015165a:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00151664:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return;
}

Assistant:

static void mkdir_cb(uv_fs_t* req) {
  ASSERT(req == &mkdir_req);
  ASSERT(req->fs_type == UV_FS_MKDIR);
  ASSERT(req->result == 0);
  mkdir_cb_count++;
  ASSERT(req->path);
  ASSERT(memcmp(req->path, "test_dir\0", 9) == 0);
  uv_fs_req_cleanup(req);
}